

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void createFloorGridMesh(void)

{
  int j;
  int iVar1;
  int i;
  int iVar2;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar3;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar4;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar5;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_70;
  undefined4 uStack_6c;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_68;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_64;
  int local_60;
  float local_5c;
  Vector<glm::vec<3,_float,_(glm::qualifier)0>_> verts;
  u32 vbo [2];
  
  (*glad_debug_glGenVertexArrays)(2,&gpu::floorGridVao);
  (*glad_debug_glGenBuffers)(2,vbo);
  (*glad_debug_glBindVertexArray)(gpu::floorGridVao);
  (*glad_debug_glBindBuffer)(0x8892,vbo[0]);
  verts._data = (vec<3,_float,_(glm::qualifier)0> *)0x0;
  verts._size = 0;
  verts._capacity = 0;
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::reserve(&verts,0x194);
  local_70.x = -1.0;
  uStack_6c = 0;
  local_68 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
            (&verts,(vec<3,_float,_(glm::qualifier)0> *)&local_70);
  local_70.x = 1.0;
  uStack_6c = 0;
  local_68 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
            (&verts,(vec<3,_float,_(glm::qualifier)0> *)&local_70);
  local_70.x = 0.0;
  uStack_6c = 0;
  local_68 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbf800000;
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
            (&verts,(vec<3,_float,_(glm::qualifier)0> *)&local_70);
  local_70.x = 0.0;
  uStack_6c = 0;
  local_68 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
            (&verts,(vec<3,_float,_(glm::qualifier)0> *)&local_70);
  for (iVar2 = 1; iVar2 != 0x33; iVar2 = iVar2 + 1) {
    aVar5.x = (float)iVar2 * -0.02;
    local_70.x = -1.0;
    uStack_6c = 0;
    local_68.x = aVar5.x;
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              (&verts,(vec<3,_float,_(glm::qualifier)0> *)&local_70);
    local_70.x = 1.0;
    uStack_6c = 0;
    local_68.x = aVar5.x;
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              (&verts,(vec<3,_float,_(glm::qualifier)0> *)&local_70);
    aVar3.x = (float)iVar2 * 0.02;
    local_70.x = -1.0;
    uStack_6c = 0;
    local_68.x = aVar3.x;
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              (&verts,(vec<3,_float,_(glm::qualifier)0> *)&local_70);
    local_70.x = 1.0;
    uStack_6c = 0;
    local_68.x = aVar3.x;
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              (&verts,(vec<3,_float,_(glm::qualifier)0> *)&local_70);
    uStack_6c = 0;
    local_68 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbf800000;
    local_70.x = aVar5.x;
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              (&verts,(vec<3,_float,_(glm::qualifier)0> *)&local_70);
    uStack_6c = 0;
    local_68 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
    local_70.x = aVar5.x;
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              (&verts,(vec<3,_float,_(glm::qualifier)0> *)&local_70);
    uStack_6c = 0;
    local_68 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbf800000;
    local_70.x = aVar3.x;
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              (&verts,(vec<3,_float,_(glm::qualifier)0> *)&local_70);
    uStack_6c = 0;
    local_68 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
    local_70.x = aVar3.x;
    tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::push_back
              (&verts,(vec<3,_float,_(glm::qualifier)0> *)&local_70);
  }
  (*glad_debug_glBufferData)(0x8892,verts._size * 0xc,verts._data,0x88e4);
  (*glad_debug_glEnableVertexAttribArray)(0);
  (*glad_debug_glVertexAttribPointer)(0,3,0x1406,'\0',0,(void *)0x0);
  (*glad_debug_glBindVertexArray)(DAT_0032cb0c);
  (*glad_debug_glBindBuffer)(0x8892,vbo[1]);
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::resize<>(&verts,0);
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::reserve(&verts,0xaf0);
  for (iVar2 = 0; iVar2 != 0x32; iVar2 = iVar2 + 1) {
    local_5c = (float)iVar2;
    aVar3.x = 1.4013e-45;
    for (iVar1 = 1; iVar1 != 8; iVar1 = iVar1 + 1) {
      local_70.x = -NAN;
      local_60 = 0;
      aVar5.x = local_5c * -0.02 - (float)iVar1 * 0.0025;
      local_64.x = aVar5.x;
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<int,int,float>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)&verts,(int *)&local_70,&local_60,
                 &local_64.x);
      local_60 = 0;
      local_70.x = aVar3.x;
      local_64.x = aVar5.x;
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<int,int,float>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)&verts,(int *)&local_70,&local_60,
                 &local_64.x);
      local_70.x = -NAN;
      local_60 = 0;
      aVar4.x = local_5c * 0.02 + (float)iVar1 * 0.0025;
      local_64.x = aVar4.x;
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<int,int,float>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)&verts,(int *)&local_70,&local_60,
                 &local_64.x);
      local_60 = 0;
      local_70.x = aVar3.x;
      local_64.x = aVar4.x;
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<int,int,float>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)&verts,(int *)&local_70,&local_60,
                 &local_64.x);
      local_60 = 0;
      local_64.x = -NAN;
      local_70.x = aVar5.x;
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<float,int,int>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)&verts,&local_70.x,&local_60,
                 (int *)&local_64);
      local_60 = 0;
      local_70.x = aVar5.x;
      local_64.x = aVar3.x;
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<float,int,int>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)&verts,&local_70.x,&local_60,
                 (int *)&local_64);
      local_60 = 0;
      local_64.x = -NAN;
      local_70.x = aVar4.x;
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<float,int,int>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)&verts,&local_70.x,&local_60,
                 (int *)&local_64);
      local_60 = 0;
      local_70.x = aVar4.x;
      local_64.x = aVar3.x;
      tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<float,int,int>
                ((Vector<glm::vec<3,float,(glm::qualifier)0>> *)&verts,&local_70.x,&local_60,
                 (int *)&local_64);
    }
  }
  (*glad_debug_glBufferData)(0x8892,verts._size * 0xc,verts._data,0x88e4);
  (*glad_debug_glEnableVertexAttribArray)(0);
  (*glad_debug_glVertexAttribPointer)(0,3,0x1406,'\0',0,(void *)0x0);
  tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::~Vector(&verts);
  return;
}

Assistant:

void createFloorGridMesh()
{
    glGenVertexArrays(2, gpu::floorGridVao);
    u32 vbo[2];
    glGenBuffers(2, vbo);

    // thick lines
    glBindVertexArray(gpu::floorGridVao[0]);
    glBindBuffer(GL_ARRAY_BUFFER, vbo[0]);
    tl::Vector<vec3> verts;
    constexpr int n = FLOOR_GRID_RESOLUTION;
    verts.reserve(4 + 8*n);
    // fist the 2 lines that pass though the origin
    verts.push_back({-1, 0, 0});
    verts.push_back({+1, 0, 0});
    verts.push_back({0, 0, -1});
    verts.push_back({0, 0, +1});
    // the rest of the lines
    const float d = float(1) / n; // distance between lines
    for(int i = 1; i <= n; i++) {
        verts.push_back({-1, 0, -d*i});
        verts.push_back({+1, 0, -d*i});
        verts.push_back({-1, 0, +d*i});
        verts.push_back({+1, 0, +d*i});

        verts.push_back({-d*i, 0, -1});
        verts.push_back({-d*i, 0, +1});
        verts.push_back({+d*i, 0, -1});
        verts.push_back({+d*i, 0, +1});
    }
    glBufferData(GL_ARRAY_BUFFER, verts.size() * sizeof(vec3), verts.data(), GL_STATIC_DRAW);
    glEnableVertexAttribArray(0);
    glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 0, nullptr);

    // subdivisions
    glBindVertexArray(gpu::floorGridVao[1]);
    glBindBuffer(GL_ARRAY_BUFFER, vbo[1]);

    const int m = FLOOR_GRID_SUBDIVS;
    const float dd = d / m;
    verts.resize(0);
    verts.reserve(8*n*(m-1));
    for(int i = 0; i < n; i++)
    for(int j = 1; j < m; j++) {
        verts.emplace_back(-1, 0, -d*i - dd*j);
        verts.emplace_back(+1, 0, -d*i - dd*j);
        verts.emplace_back(-1, 0, +d*i + dd*j);
        verts.emplace_back(+1, 0, +d*i + dd*j);

        verts.emplace_back(-d*i - dd*j, 0, -1);
        verts.emplace_back(-d*i - dd*j, 0, +1);
        verts.emplace_back(+d*i + dd*j, 0, -1);
        verts.emplace_back(+d*i + dd*j, 0, +1);
    }
    glBufferData(GL_ARRAY_BUFFER, verts.size() * sizeof(vec3), verts.data(), GL_STATIC_DRAW);
    glEnableVertexAttribArray(0);
    glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 0, nullptr);
}